

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityPlot.cpp
# Opt level: O0

void __thiscall OpenMD::DensityPlot::writeDensity(DensityPlot *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  void *this_00;
  undefined8 uVar6;
  long in_RDI;
  uint i;
  ofstream ofs;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"DensityPlot: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"#g(x, y, z)\n");
    poVar3 = std::operator<<(local_208,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x120));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"#cmSelection:(");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x758));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"#nRBins = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0xe0));
    poVar3 = std::operator<<(poVar3,"\t maxLen = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0xd0));
    poVar3 = std::operator<<(poVar3,"\tdeltaR = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0xe8));
    std::operator<<(poVar3,"\n");
    for (local_218 = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf0)), local_218 < sVar4;
        local_218 = local_218 + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (local_208,
                          (double)local_218 * *(double *)(in_RDI + 0xe8) -
                          *(double *)(in_RDI + 0xd8));
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),
                          (ulong)local_218);
      this_00 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void DensityPlot::writeDensity() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      ofs << "#g(x, y, z)\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "#cmSelection:(" << cmSelectionScript_ << ")\n";
      ofs << "#nRBins = " << nRBins_ << "\t maxLen = " << len_
          << "\tdeltaR = " << deltaR_ << "\n";
      for (unsigned int i = 0; i < histogram_.size(); ++i) {
        ofs << i * deltaR_ - halfLen_ << "\t" << density_[i] << std::endl;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DensityPlot: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }